

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.cpp
# Opt level: O1

shared_ptr<SchemeObject>
make_function(string *name,
             list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *l,
             Context *context,string *form)

{
  bool bVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  _Node *p_Var6;
  _Node *p_Var7;
  runtime_error *prVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Context *pCVar10;
  _List_node_base *p_Var11;
  shared_ptr<SchemeObject> sVar12;
  shared_ptr<SchemeCompoundProcedure> f;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> pl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  _Alloc_hider local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Context *local_60;
  string *local_58;
  string *local_50;
  _List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> local_48;
  
  if ((context->locals).
      super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
      ._M_impl._M_node._M_size < 2) {
LAB_0012b17b:
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_98,in_R8,": parameters and code required");
    std::runtime_error::runtime_error(prVar8,(string *)&bStack_98);
    *(undefined ***)prVar8 = &PTR__runtime_error_0016b300;
    __cxa_throw(prVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var11 = (context->locals).
            super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (*(int *)p_Var11[1]._M_next != 0) goto LAB_0012b17b;
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::list
            ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)&local_48
             ,(list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
              ((long)p_Var11[1]._M_next + 0x28));
  iVar5 = std::__cxx11::string::compare((char *)in_R8);
  if (iVar5 != 0) {
    iVar5 = std::__cxx11::string::compare((char *)in_R8);
    if (iVar5 != 0) goto LAB_0012ae6e;
  }
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::_M_erase
            ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)&local_48
             ,(iterator)local_48._M_impl._M_node.super__List_node_base._M_next);
LAB_0012ae6e:
  local_70._M_p = (pointer)0x0;
  local_78 = in_R8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SchemeCompoundProcedure,std::allocator<SchemeCompoundProcedure>,std::__cxx11::string_const&>
            (&local_68,(SchemeCompoundProcedure **)&local_70,
             (allocator<SchemeCompoundProcedure> *)&bStack_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l);
  if (local_48._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    uVar9 = 0;
    p_Var11 = local_48._M_impl._M_node.super__List_node_base._M_next;
    local_60 = context;
    local_58 = form;
    local_50 = name;
    do {
      if (*(int *)&(p_Var11[1]._M_next)->_M_next != 1) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&bStack_98,local_78,": list of names required");
        std::runtime_error::runtime_error(prVar8,(string *)&bStack_98);
        *(undefined ***)prVar8 = &PTR__runtime_error_0016b300;
        __cxa_throw(prVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar5 = std::__cxx11::string::compare((char *)&(p_Var11[1]._M_next)->_M_prev);
      if (iVar5 == 0) {
        if (uVar9 != 0) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&bStack_98,local_78,": invalid declaration");
          std::runtime_error::runtime_error(prVar8,(string *)&bStack_98);
          *(undefined ***)prVar8 = &PTR__runtime_error_0016b300;
          __cxa_throw(prVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar9 = 1;
        bVar1 = false;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&(p_Var11[1]._M_next)->_M_prev);
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare((char *)&(p_Var11[1]._M_next)->_M_prev);
          _Var3._M_p = local_70._M_p;
          if (iVar5 != 0) {
            p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                     _M_create_node<std::__cxx11::string_const&>
                               ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                                (local_70._M_p + 0x38),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&(p_Var11[1]._M_next)->_M_prev);
            std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
            *(long *)(_Var3._M_p + 0x48) = *(long *)(_Var3._M_p + 0x48) + 1;
            context = local_60;
            if (uVar9 == 2) {
              uVar9 = 3;
            }
            else {
              if (uVar9 != 1) {
                if (uVar9 != 0) {
                  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::operator+(&bStack_98,local_78,": invalid declaration");
                  std::runtime_error::runtime_error(prVar8,(string *)&bStack_98);
                  *(undefined ***)prVar8 = &PTR__runtime_error_0016b300;
                  __cxa_throw(prVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
                }
                *(long *)(local_70._M_p + 0x28) = *(long *)(local_70._M_p + 0x28) + 1;
                *(long *)(local_70._M_p + 0x30) = *(long *)(local_70._M_p + 0x30) + 1;
                bVar1 = false;
                uVar9 = 0;
                goto LAB_0012afca;
              }
              *(long *)(local_70._M_p + 0x30) = *(long *)(local_70._M_p + 0x30) + 1;
              uVar9 = 1;
            }
            bVar1 = false;
            goto LAB_0012afca;
          }
        }
        if (1 < uVar9) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&bStack_98,local_78,": invalid declaration");
          std::runtime_error::runtime_error(prVar8,(string *)&bStack_98);
          *(undefined ***)prVar8 = &PTR__runtime_error_0016b300;
          __cxa_throw(prVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_70._M_p[0x30] = -1;
        local_70._M_p[0x31] = -1;
        local_70._M_p[0x32] = -1;
        local_70._M_p[0x33] = -1;
        local_70._M_p[0x34] = -1;
        local_70._M_p[0x35] = -1;
        local_70._M_p[0x36] = -1;
        local_70._M_p[0x37] = -1;
        uVar9 = 2;
        bVar1 = true;
      }
LAB_0012afca:
      p_Var11 = (((_List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                   *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var11 != (_List_node_base *)&local_48);
    form = local_58;
    name = local_50;
    if (bVar1) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_98,local_78,": invalid declaration");
      std::runtime_error::runtime_error(prVar8,(string *)&bStack_98);
      *(undefined ***)prVar8 = &PTR__runtime_error_0016b300;
      __cxa_throw(prVar8,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  for (pCVar10 = (Context *)
                 ((context->locals).
                  super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      _Var3._M_p = local_70._M_p, pCVar10 != context;
      pCVar10 = (Context *)
                (pCVar10->locals).
                super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
    p_Var7 = std::__cxx11::list<ASTNode,std::allocator<ASTNode>>::_M_create_node<ASTNode_const&>
                       ((list<ASTNode,std::allocator<ASTNode>> *)(local_70._M_p + 0x50),
                        (ASTNode *)
                        (pCVar10->locals).
                        super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
                        ._M_impl._M_node._M_size);
    std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
    pcVar2 = _Var3._M_p + 0x60;
    *(long *)pcVar2 = *(long *)pcVar2 + 1;
  }
  if ((string *)(local_70._M_p + 0x68) != form) {
    std::__cxx11::
    list<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>,std::allocator<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>>>
    ::
    _M_assign_dispatch<std::_List_const_iterator<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>>>
              ((list<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>,std::allocator<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>>>
                *)(local_70._M_p + 0x68),(form->_M_dataplus)._M_p,form);
  }
  _Var4._M_pi = local_68._M_pi;
  _Var3._M_p[0x80] = (form->field_2)._M_local_buf[8];
  (name->_M_dataplus)._M_p = local_70._M_p;
  name->_M_string_length = 0;
  local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  name->_M_string_length = (size_type)_Var4._M_pi;
  std::__cxx11::_List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
  _M_clear(&local_48);
  sVar12.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar12.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)name;
  return (shared_ptr<SchemeObject>)
         sVar12.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<SchemeObject>
make_function(const std::string &name, const std::list<std::shared_ptr<ASTNode>> &l, const Context &context,
              const std::string &form)
{
    if(l.size() < 2 || l.front()->type != ast_type_t::LIST)
        throw eval_error(form + ": parameters and code required");
    auto pl = l.front()->list;
    if(form == "define" || form == "named-lambda")
        pl.pop_front();
    auto f = std::make_shared<SchemeCompoundProcedure>(name);
    int state = 0;
    for(const auto &i : pl)
    {
        if(i->type != ast_type_t::NAME)
            throw eval_error(form + ": list of names required");
        if(i->value == "#!optional")
        {
            if(state != 0)
                throw eval_error(form + ": invalid declaration");
            state = 1;
        }
        else if(i->value == "#!rest" || i->value == ".")
        {
            if(state > 1)
                throw eval_error(form + ": invalid declaration");
            state = 2;
            f->arity.second = -1;
        }
        else
        {
            f->params.push_back(i->value);
            if(state == 0)
            {
                ++f->arity.first;
                ++f->arity.second;
            }
            else if(state == 1)
            {
                ++f->arity.second;
            }
            else if(state == 2)
            {
                state = 3;
            }
            else
                throw eval_error(form + ": invalid declaration");
        }
    }
    if(state == 2)
        throw eval_error(form + ": invalid declaration");
    for(auto i = next(l.begin()); i != l.end(); ++i)
    {
        f->body.push_back(**i);
    }
    f->context = context;
    return f;
}